

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O2

int rfc5444_writer_register_addrtlvtype
              (rfc5444_writer *writer,rfc5444_writer_tlvtype *type,int msgtype)

{
  rfc5444_writer_message *msg;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x120,
                  "int rfc5444_writer_register_addrtlvtype(struct rfc5444_writer *, struct rfc5444_writer_tlvtype *, int)"
                 );
  }
  if ((uint)msgtype < 0x100) {
    msg = _get_message(writer,(uint8_t)msgtype);
    if (msg == (rfc5444_writer_message *)0x0) {
      return -1;
    }
  }
  else {
    msg = (rfc5444_writer_message *)0x0;
  }
  _register_addrtlvtype(writer,msg,type);
  return 0;
}

Assistant:

int
rfc5444_writer_register_addrtlvtype(struct rfc5444_writer *writer, struct rfc5444_writer_tlvtype *type, int msgtype) {
  struct rfc5444_writer_message *msg = NULL;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  if (msgtype >= 0 && msgtype <= 255) {
    if ((msg = _get_message(writer, msgtype)) == NULL) {
      /* out of memory error ? */
      return -1;
    }
  }

  _register_addrtlvtype(writer, msg, type);
  return 0;
}